

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

_Bool rf_check_collision_circle_rec(rf_vec2 center,float radius,rf_rec rec)

{
  float fVar1;
  float fVar2;
  float cornerDistanceSq;
  float dy;
  float dx;
  int recCenterY;
  int recCenterX;
  float radius_local;
  rf_rec rec_local;
  rf_vec2 center_local;
  
  recCenterX = (int)rec.x;
  rec_local.x = rec.width;
  radius_local = rec.y;
  rec_local.y = rec.height;
  rec_local.width = center.x;
  fVar1 = ABS(rec_local.width - (float)(int)((float)recCenterX + rec_local.x / 2.0));
  rec_local.height = center.y;
  fVar2 = ABS(rec_local.height - (float)(int)(radius_local + rec_local.y / 2.0));
  if (fVar1 <= rec_local.x / 2.0 + radius) {
    if (fVar2 <= rec_local.y / 2.0 + radius) {
      if (rec_local.x / 2.0 < fVar1) {
        if (rec_local.y / 2.0 < fVar2) {
          center_local.x._3_1_ =
               (fVar1 - rec_local.x / 2.0) * (fVar1 - rec_local.x / 2.0) +
               (fVar2 - rec_local.y / 2.0) * (fVar2 - rec_local.y / 2.0) <= radius * radius;
        }
        else {
          center_local.x._3_1_ = true;
        }
      }
      else {
        center_local.x._3_1_ = true;
      }
    }
    else {
      center_local.x._3_1_ = false;
    }
  }
  else {
    center_local.x._3_1_ = false;
  }
  return center_local.x._3_1_;
}

Assistant:

bool rf_check_collision_circle_rec(rf_vec2 center, float radius, rf_rec rec)
{
    int recCenterX = (int) (rec.x + rec.width / 2.0f);
    int recCenterY = (int) (rec.y + rec.height / 2.0f);

    float dx = (float) fabs(center.x - recCenterX);
    float dy = (float) fabs(center.y - recCenterY);

    if (dx > (rec.width / 2.0f + radius))
    { return 0; }
    if (dy > (rec.height / 2.0f + radius))
    { return 0; }

    if (dx <= (rec.width / 2.0f))
    { return 1; }
    if (dy <= (rec.height / 2.0f))
    { return 1; }

    float cornerDistanceSq = (dx - rec.width / 2.0f) * (dx - rec.width / 2.0f) +
                             (dy - rec.height / 2.0f) * (dy - rec.height / 2.0f);

    return (cornerDistanceSq <= (radius * radius));
}